

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool bitset_array_container_iandnot
                (bitset_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  int iVar1;
  uint64_t uVar2;
  array_container_t *paVar3;
  bitset_container_t *in_RDX;
  uint64_t *in_RSI;
  int *in_RDI;
  uint16_t *in_stack_ffffffffffffffd8;
  
  *(int **)in_RDX = in_RDI;
  uVar2 = bitset_clear_list(in_RSI,(uint64_t)in_RDX,in_stack_ffffffffffffffd8,0x128e77);
  *in_RDI = (int)uVar2;
  iVar1 = *in_RDI;
  if (0x1000 >= iVar1) {
    paVar3 = array_container_from_bitset(in_RDX);
    *(array_container_t **)in_RDX = paVar3;
    bitset_container_free((bitset_container_t *)0x128eac);
  }
  return 0x1000 < iVar1;
}

Assistant:

bool bitset_array_container_iandnot(bitset_container_t *src_1,
                                    const array_container_t *src_2,
                                    container_t **dst) {
    *dst = src_1;
    src_1->cardinality =
        (int32_t)bitset_clear_list(src_1->words, (uint64_t)src_1->cardinality,
                                   src_2->array, (uint64_t)src_2->cardinality);

    if (src_1->cardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(src_1);
        bitset_container_free(src_1);
        return false;  // not bitset
    } else
        return true;
}